

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O1

void cft_fasttext_get_word_vector(fasttext_t *handle,char *word,float *buf)

{
  int iVar1;
  Vector vec;
  allocator local_51;
  Vector local_50;
  string local_38;
  
  iVar1 = fasttext::FastText::getDimension((FastText *)handle);
  fasttext::Vector::Vector(&local_50,(long)iVar1);
  std::__cxx11::string::string((string *)&local_38,word,&local_51);
  fasttext::FastText::getWordVector((FastText *)handle,&local_50,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  memcpy(buf,local_50.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,
         (long)local_50.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_50.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
  if (local_50.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cft_fasttext_get_word_vector(fasttext_t* handle, const char* word, float* buf) {
    Vector vec(((FastText*)handle)->getDimension());
    ((FastText*)handle)->getWordVector(vec, word);
    memcpy(buf, vec.data(), vec.size() * sizeof(real));
}